

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOICompactRewardDecPOMDPDiscrete::SoftPrint_abi_cxx11_(TOICompactRewardDecPOMDPDiscrete *this)

{
  long *in_RSI;
  
  SoftPrint_abi_cxx11_
            ((string *)this,
             (TOICompactRewardDecPOMDPDiscrete *)((long)in_RSI + *(long *)(*in_RSI + -0x180)));
  return;
}

Assistant:

string TOICompactRewardDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TOIDecPOMDPDiscrete::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward models: " << endl;
        for(unsigned int i=0;i!=GetNrAgents();++i)
        {
            ss << "Individual rewards for agent " << i << endl;
            ss << _m_p_rModels[i]->SoftPrint();
        }
    }
    else
        throw E("TOICompactRewardDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}